

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmap.c
# Opt level: O3

void coll_tmap_balance_remove(coll_tmap_t *map,entry_t_conflict *entry)

{
  coll_tmap_entry_t *pcVar1;
  coll_tmap_entry_t *entry_00;
  entry_t_conflict *peVar2;
  coll_tmap_entry_t *pcVar3;
  
  peVar2 = entry;
  if (map->root != entry) {
    do {
      if (peVar2 == (entry_t_conflict *)0x0) {
LAB_00105f9d:
        entry = (entry_t_conflict *)0x0;
      }
      else {
        entry = peVar2;
        if (peVar2->color != '\0') goto LAB_001060b0;
        entry = peVar2->parent;
        if (entry == (entry_t_conflict *)0x0) goto LAB_00105f9d;
        if (peVar2 == entry->left) {
          entry_00 = entry->right;
          if (entry_00 == (coll_tmap_entry_t *)0x0) goto LAB_00105f9f;
          if (entry_00->color == '\x01') {
            entry_00->color = '\0';
            entry->color = '\x01';
            entry_rotate_left(map,entry);
            entry = peVar2->parent;
            if (entry == (coll_tmap_entry_t *)0x0) goto LAB_00105f9d;
            entry_00 = entry->right;
            if (entry_00 == (coll_tmap_entry_t *)0x0) goto LAB_00105f9f;
          }
          pcVar3 = entry_00->left;
          if ((pcVar3 == (coll_tmap_entry_t *)0x0) || (pcVar3->color == '\0')) {
            pcVar1 = entry_00->right;
            if ((pcVar1 == (coll_tmap_entry_t *)0x0) || (pcVar1->color == '\0')) goto LAB_00106078;
            if (pcVar1->color == '\0') {
              if (pcVar3 != (coll_tmap_entry_t *)0x0) goto LAB_00106034;
              goto LAB_00106038;
            }
LAB_0010605c:
            entry_00->color = entry->color;
            entry->color = '\0';
            pcVar3 = entry_00->right;
            if (pcVar3 != (coll_tmap_entry_t *)0x0) {
LAB_00106072:
              pcVar3->color = '\0';
            }
          }
          else {
            if ((entry_00->right != (coll_tmap_entry_t *)0x0) && (entry_00->right->color != '\0'))
            goto LAB_0010605c;
LAB_00106034:
            pcVar3->color = '\0';
LAB_00106038:
            entry_00->color = '\x01';
            entry_rotate_right(map,entry_00);
            entry = peVar2->parent;
            if (entry != (coll_tmap_entry_t *)0x0) {
              entry_00 = entry->right;
              pcVar3 = entry;
              if (entry_00 != (coll_tmap_entry_t *)0x0) goto LAB_0010605c;
              goto LAB_00106072;
            }
            entry = (entry_t_conflict *)0x0;
          }
          entry_rotate_left(map,entry);
LAB_0010609d:
          entry = map->root;
        }
        else {
          entry_00 = entry->left;
          if (entry_00 != (coll_tmap_entry_t *)0x0) {
            if (entry_00->color == '\x01') {
              entry_00->color = '\0';
              entry->color = '\x01';
              entry_rotate_right(map,entry);
              entry = peVar2->parent;
              if (entry == (coll_tmap_entry_t *)0x0) goto LAB_00105f9d;
              entry_00 = entry->left;
              if (entry_00 == (coll_tmap_entry_t *)0x0) goto LAB_00105f9f;
            }
            pcVar3 = entry_00->right;
            if ((pcVar3 != (coll_tmap_entry_t *)0x0) && (pcVar3->color != '\0')) {
              if ((entry_00->left == (coll_tmap_entry_t *)0x0) || (entry_00->left->color == '\0')) {
LAB_00105fd2:
                pcVar3->color = '\0';
LAB_00105fd6:
                entry_00->color = '\x01';
                entry_rotate_left(map,entry_00);
                entry = peVar2->parent;
                if (entry != (entry_t_conflict *)0x0) {
                  entry_00 = entry->left;
                  peVar2 = entry;
                  if (entry_00 != (coll_tmap_entry_t *)0x0) goto LAB_00105ffe;
                  goto LAB_00106014;
                }
                entry = (entry_t_conflict *)0x0;
              }
              else {
LAB_00105ffe:
                entry_00->color = entry->color;
                entry->color = '\0';
                peVar2 = entry_00->left;
                if (peVar2 != (entry_t_conflict *)0x0) {
LAB_00106014:
                  peVar2->color = '\0';
                }
              }
              entry_rotate_right(map,entry);
              goto LAB_0010609d;
            }
            pcVar1 = entry_00->left;
            if ((pcVar1 != (coll_tmap_entry_t *)0x0) && (pcVar1->color != '\0')) {
              if (pcVar1->color == '\0') {
                if (pcVar3 != (coll_tmap_entry_t *)0x0) goto LAB_00105fd2;
                goto LAB_00105fd6;
              }
              goto LAB_00105ffe;
            }
LAB_00106078:
            entry_00->color = '\x01';
          }
        }
      }
LAB_00105f9f:
      peVar2 = entry;
    } while (entry != map->root);
  }
  if (entry != (entry_t_conflict *)0x0) {
LAB_001060b0:
    entry->color = '\0';
  }
  return;
}

Assistant:

static void coll_tmap_balance_remove(coll_tmap_t *map, entry_t *entry) {
    while (entry != map->root && color(entry) == BLACK) {
        if (entry == left(parent(entry))) {
            entry_t *sib = right(parent(entry));  // sibling

            if (color(sib) == RED) {
                dye(sib, BLACK);
                dye(parent(entry), RED);
                entry_rotate_left(map, parent(entry));
                sib = right(parent(entry));
            }

            if (color(left(sib)) == BLACK && color(right(sib)) == BLACK) {
                dye(sib, RED);
                entry = parent(entry);
            } else {
                if (color(right(sib)) == BLACK) {
                    dye(left(sib), BLACK);
                    dye(sib, RED);
                    entry_rotate_right(map, sib);
                    sib = right(parent(entry));
                }
                dye(sib, color(parent(entry)));
                dye(parent(entry), BLACK);
                dye(right(sib), BLACK);
                entry_rotate_left(map, parent(entry));
                entry = map->root;
            }
        } else {
            entry_t *sib = left(parent(entry));

            if (color(sib) == RED) {
                dye(sib, BLACK);
                dye(parent(entry), RED);
                entry_rotate_right(map, parent(entry));
                sib = left(parent(entry));
            }

            if (color(right(sib)) == BLACK && color(left(sib)) == BLACK) {
                dye(sib, RED);
                entry = parent(entry);
            } else {
                if (color(left(sib)) == BLACK) {
                    dye(right(sib), BLACK);
                    dye(sib, RED);
                    entry_rotate_left(map, sib);
                    sib = left(parent(entry));
                }
                dye(sib, color(parent(entry)));
                dye(parent(entry), BLACK);
                dye(left(sib), BLACK);
                entry_rotate_right(map, parent(entry));
                entry = map->root;
            }
        }
    }
    dye(entry, BLACK);
}